

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O3

void __thiscall
efsw::FileWatcherInotify::handleAction
          (FileWatcherInotify *this,Watcher *watch,string *filename,unsigned_long action,
          string oldFilename)

{
  string *__lhs;
  WatchID WVar1;
  FileWatchListener *pFVar2;
  size_type sVar3;
  pointer pcVar4;
  _Base_ptr p_Var5;
  _Base_ptr __n;
  Uint64 UVar6;
  bool bVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  _Self __tmp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  _Self __tmp_1;
  _Rb_tree_header *p_Var13;
  string opath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  WatchID local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  FileInfo local_78;
  
  if (watch == (Watcher *)0x0) {
    return;
  }
  if (watch->Listener == (FileWatchListener *)0x0) {
    return;
  }
  __lhs = &watch->Directory;
  std::operator+(&local_1c8,__lhs,filename);
  if ((action & 10) == 0) {
    if ((char)action < '\0') {
      local_1a0 = &watch->OldFileName;
      sVar3 = (watch->OldFileName)._M_string_length;
      local_1a8 = watch->ID;
      pFVar2 = watch->Listener;
      if (sVar3 == 0) {
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,local_1a8,__lhs,filename,1,local_118);
        if (local_118[0] != local_108) {
          operator_delete(local_118[0],local_108[0] + 1);
        }
        WVar1 = watch->ID;
        pFVar2 = watch->Listener;
        local_138[0] = local_128;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,3,local_138);
        if (local_138[0] != local_128) {
          operator_delete(local_138[0],local_128[0] + 1);
        }
        paVar11 = &local_b8.field_2;
        local_b8._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_1c8._M_dataplus._M_p,
                   (long)(_Rb_tree_color *)local_1c8._M_string_length + local_1c8._M_dataplus._M_p);
        checkForNewWatcher(this,watch,&local_b8);
        _Var12._M_p = local_b8._M_dataplus._M_p;
      }
      else {
        paVar11 = &local_c8;
        pcVar4 = (local_1a0->_M_dataplus)._M_p;
        local_d8[0] = paVar11;
        std::__cxx11::string::_M_construct<char*>((string *)local_d8,pcVar4,pcVar4 + sVar3);
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,local_1a8,__lhs,filename,4,local_d8);
        _Var12._M_p = (pointer)local_d8[0];
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var12._M_p != paVar11) {
        operator_delete(_Var12._M_p,paVar11->_M_allocated_capacity + 1);
      }
      if ((watch->Recursive == true) && (bVar7 = FileSystem::isDirectory(&local_1c8), bVar7)) {
        std::operator+(&local_158,__lhs,local_1a0);
        FileSystem::dirAddSlashAtEnd(&local_158);
        FileSystem::dirAddSlashAtEnd(&local_1c8);
        p_Var10 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var13 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var10 != p_Var13) {
          do {
            p_Var5 = p_Var10[1]._M_parent;
            __n = p_Var5->_M_right;
            if ((__n == (_Base_ptr)local_158._M_string_length) &&
               ((__n == (_Base_ptr)0x0 ||
                (iVar8 = bcmp(p_Var5->_M_left,local_158._M_dataplus._M_p,(size_t)__n), iVar8 == 0)))
               ) {
              p_Var5 = p_Var5[5]._M_parent;
              FileInfo::FileInfo(&local_78,&local_158);
              UVar6 = local_78.Inode;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
                operator_delete(local_78.Filepath._M_dataplus._M_p,
                                local_78.Filepath.field_2._M_allocated_capacity + 1);
              }
              if (p_Var5 == (_Base_ptr)UVar6) {
                std::__cxx11::string::_M_assign((string *)&(p_Var10[1]._M_parent)->_M_left);
                FileInfo::FileInfo(&local_78,&local_1c8);
                FileInfo::operator=((FileInfo *)&p_Var10[1]._M_parent[3]._M_parent,&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
                  operator_delete(local_78.Filepath._M_dataplus._M_p,
                                  local_78.Filepath.field_2._M_allocated_capacity + 1);
                }
                break;
              }
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var13);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_1a0,0,(char *)(watch->OldFileName)._M_string_length,0x11f2e5);
      goto LAB_00119398;
    }
    if (((uint)action >> 8 & 1) == 0) {
      if ((action & 0x40) == 0) {
        if (((uint)action >> 9 & 1) != 0) {
          WVar1 = watch->ID;
          pFVar2 = watch->Listener;
          local_198[0] = local_188;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
          (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,2,local_198);
          if (local_198[0] != local_188) {
            operator_delete(local_198[0],local_188[0] + 1);
          }
          FileSystem::dirAddSlashAtEnd(&local_1c8);
          _Var12._M_p = local_1c8._M_dataplus._M_p;
          if (watch->Recursive == true) {
            for (p_Var9 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var9 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
                p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
              p_Var10 = p_Var9[1]._M_parent;
              if ((p_Var10->_M_right == (_Base_ptr)local_1c8._M_string_length) &&
                 (((_Base_ptr)local_1c8._M_string_length == (_Base_ptr)0x0 ||
                  (iVar8 = bcmp(p_Var10->_M_left,_Var12._M_p,local_1c8._M_string_length), iVar8 == 0
                  )))) {
                (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[4])(this,p_Var10->_M_parent);
                break;
              }
            }
          }
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&watch->OldFileName);
      }
      goto LAB_00119398;
    }
    WVar1 = watch->ID;
    pFVar2 = watch->Listener;
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,1,local_178);
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    paVar11 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_1c8._M_dataplus._M_p,
               (long)(_Rb_tree_color *)local_1c8._M_string_length + local_1c8._M_dataplus._M_p);
    checkForNewWatcher(this,watch,&local_f8);
    _Var12._M_p = local_f8._M_dataplus._M_p;
  }
  else {
    WVar1 = watch->ID;
    pFVar2 = watch->Listener;
    paVar11 = &local_88;
    local_98[0] = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,3,local_98);
    _Var12._M_p = (pointer)local_98[0];
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p != paVar11) {
    operator_delete(_Var12._M_p,paVar11->_M_allocated_capacity + 1);
  }
LAB_00119398:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FileWatcherInotify::handleAction( Watcher* watch, const std::string& filename, unsigned long action, std::string oldFilename )
{
	if ( !watch || !watch->Listener )
	{
		return;
	}

	std::string fpath( watch->Directory + filename );

	if ( ( IN_CLOSE_WRITE & action ) || ( IN_MODIFY & action ) )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );
	}
	else if( IN_MOVED_TO & action )
	{
		/// If OldFileName doesn't exist means that the file has been moved from other folder, so we just send the Add event
		if ( watch->OldFileName.empty() )
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );

			checkForNewWatcher( watch, fpath );
		}
		else
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Moved, watch->OldFileName );
		}

		if ( watch->Recursive && FileSystem::isDirectory( fpath ) )
		{
			/// Update the new directory path
			std::string opath( watch->Directory + watch->OldFileName );
			FileSystem::dirAddSlashAtEnd( opath );
			FileSystem::dirAddSlashAtEnd( fpath );

			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == opath && it->second->DirInfo.Inode == FileInfo( opath ).Inode )
				{
					it->second->Directory	= fpath;
					it->second->DirInfo		= FileInfo( fpath );

					break;
				}
			}
		}

		watch->OldFileName = "";
	}
	else if( IN_CREATE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

		checkForNewWatcher( watch, fpath );
	}
	else if ( IN_MOVED_FROM & action )
	{
		watch->OldFileName = filename;
	}
	else if( IN_DELETE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Delete );

		FileSystem::dirAddSlashAtEnd( fpath );

		/// If the file erased is a directory and recursive is enabled, removes the directory erased
		if ( watch->Recursive )
		{
			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == fpath )
				{
					removeWatch( it->second->ID );
					break;
				}
			}
		}
	}
}